

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest::iterate
          (MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  TestError *this_00;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1390))(0x9102,1,0x8058,1,1,0);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 == 0x500) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid error code reported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
             ,0x2ba);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest::iterate()
{
	/* NOTE: This test can be executed, no matter whether GL_OES_texture_storage_multisample_2d_array
	 *       extension is supported on the running platform, or not.
	 */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Issue call with valid parameters and GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES target */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 1, GL_RGBA8, 1, 1, false);

	/* Check if the expected error code was reported */
	if (gl.getError() != GL_INVALID_ENUM)
	{
		TCU_FAIL("Invalid error code reported");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}